

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

byte * __thiscall
Js::InterpreterStackFrame::OP_ProfiledLoopBodyStart<(Js::LayoutSize)0,true>
          (InterpreterStackFrame *this,uint loopId)

{
  byte *pbVar1;
  code *local_38;
  uint loopId_local;
  InterpreterStackFrame *this_local;
  
  *(int *)(this + 0xd0) = *(int *)(this + 0xd0) + 1;
  OP_RecordImplicitCall(this,loopId);
  local_38 = *(code **)(this + 0xf8);
  if (((ulong)local_38 & 1) != 0) {
    local_38 = *(code **)(local_38 + *(long *)(this + *(long *)(this + 0x100)) + -1);
  }
  (*local_38)(this + *(long *)(this + 0x100),loopId,0);
  pbVar1 = ByteCodeReader::GetIP((ByteCodeReader *)this);
  return pbVar1;
}

Assistant:

const byte * InterpreterStackFrame::OP_ProfiledLoopBodyStart(uint loopId)
    {
        if (profiled || isAutoProfiling)
        {
            this->currentLoopCounter++;
        }

        if (profiled)
        {
            OP_RecordImplicitCall(loopId);
        }

        (this->*(profiled ? opProfiledLoopBodyStart : opLoopBodyStart))(loopId, layoutSize, false /* isFirstIteration */);
        return m_reader.GetIP();
    }